

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O0

void __thiscall cmCTestCoverageHandler::cmCTestCoverageHandler(cmCTestCoverageHandler *this)

{
  cmCTestCoverageHandler *this_local;
  
  cmCTestGenericHandler::cmCTestGenericHandler(&this->super_cmCTestGenericHandler);
  (this->super_cmCTestGenericHandler).super_cmObject._vptr_cmObject =
       (_func_int **)&PTR__cmCTestCoverageHandler_00c15568;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->CustomCoverageExclude);
  std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::vector
            (&this->CustomCoverageExcludeRegex);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ExtraCoverageGlobs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
  ::map(&this->SourceLabels);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestCoverageHandler::LabelSet>_>_>
  ::map(&this->TargetDirs);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::map(&this->LabelIdMap);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Labels);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&this->LabelFilter);
  return;
}

Assistant:

cmCTestCoverageHandler::cmCTestCoverageHandler()
{
}